

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readSOF(FILE *f)

{
  uchar local_1e;
  uchar local_1d;
  int local_1c;
  byte local_17;
  byte local_16;
  byte local_15;
  int i;
  uchar v [3];
  FILE *pFStack_10;
  uint len;
  FILE *f_local;
  
  pFStack_10 = (FILE *)f;
  i = EnterNewSection(f,"SOF");
  fseek(pFStack_10,1,1);
  fread(&local_17,1,2,pFStack_10);
  image.height = (uint)local_17 * 0x100 + (uint)local_16;
  fread(&local_17,1,2,pFStack_10);
  image.width = (uint)local_17 * 0x100 + (uint)local_16;
  printf(anon_var_dwarf_30d8,(ulong)(uint)image.height,(ulong)(uint)image.width);
  fseek(pFStack_10,1,1);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    fread(&local_17,1,3,pFStack_10);
    printf(anon_var_dwarf_30ef,(ulong)local_17);
    printf(anon_var_dwarf_3106,(ulong)(uint)((int)(uint)local_16 >> 4));
    printf(anon_var_dwarf_311d,(ulong)(local_16 & 0xf));
    printf(anon_var_dwarf_3128,(ulong)local_15);
    subVector[local_17].id = local_17;
    subVector[local_17].width = (uchar)((int)(uint)local_16 >> 4);
    subVector[local_17].height = local_16 & 0xf;
    subVector[local_17].quant = local_15;
    if (subVector[local_17].height < maxHeight) {
      local_1d = maxHeight;
    }
    else {
      local_1d = subVector[local_17].height;
    }
    maxHeight = local_1d;
    if (subVector[local_17].width < maxWidth) {
      local_1e = maxWidth;
    }
    else {
      local_1e = subVector[local_17].width;
    }
    maxWidth = local_1e;
  }
  return;
}

Assistant:

void readSOF(FILE *f) {
    unsigned int len = EnterNewSection(f, "SOF");
    fseek(f, 1, SEEK_CUR); // 精度
    unsigned char v[3];
    fread(v, 1, 2, f);
    image.height = v[0] * 256 + v[1];
    fread(v, 1, 2, f);
    image.width = v[0] * 256 + v[1];
    printf("高*寬: %d*%d\n", image.height, image.width);
    fseek(f, 1, SEEK_CUR); // 顏色分量數，固定為3
    for (int i = 0; i < 3; i++) {
        fread(v, 1, 3, f);
        printf("顏色分量ID：%d\n", v[0]);
        printf("水平採樣因子：%d\n", v[1] >> 4);
        printf("垂直採樣因子：%d\n", v[1] & 0x0F);
        printf("量化表ID：%d\n", v[2]);
        subVector[v[0]].id = v[0];
        subVector[v[0]].width = v[1] >> 4;
        subVector[v[0]].height = v[1] & 0x0F;
        subVector[v[0]].quant = v[2];
        maxHeight = (maxHeight > subVector[v[0]].height ? maxHeight : subVector[v[0]].height);
        maxWidth = (maxWidth > subVector[v[0]].width ? maxWidth : subVector[v[0]].width);
    }
}